

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O3

void __thiscall
QSequentialAnimationGroupPrivate::activateCurrentAnimation
          (QSequentialAnimationGroupPrivate *this,bool intermediate)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *data;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data_00;
  QBindingStatus *pQVar1;
  QAbstractAnimation *this_01;
  parameter_type direction;
  int iVar2;
  long in_FS_OFFSET;
  Connection local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  data_00 = &this->currentAnimation;
  this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
  }
  if ((data_00->super_QPropertyData<QAbstractAnimation_*>).val != (QAbstractAnimation *)0x0) {
    data = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.state;
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    if ((data->super_QPropertyData<QAbstractAnimation::State>).val != Stopped) {
      pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
      }
      QAbstractAnimation::stop
                ((QAbstractAnimation *)
                 (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val);
      pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
      }
      this_01 = (QAbstractAnimation *)
                (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val;
      direction = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                  ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                           direction);
      QAbstractAnimation::setDirection(this_01,direction);
      pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
      }
      iVar2 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (data_00->super_QPropertyData<QAbstractAnimation_*>).val);
      if (iVar2 == -1) {
        pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                 super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
        if ((pQVar1 != (QBindingStatus *)0x0) &&
           (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
          QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
        }
        QObject::connect((int)&local_40,
                         (sockaddr *)
                         (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val,
                         0x58072f);
        QMetaObject::Connection::~Connection(&local_40);
      }
      pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
      }
      QAbstractAnimation::start
                ((QAbstractAnimation *)(data_00->super_QPropertyData<QAbstractAnimation_*>).val,
                 KeepWhenStopped);
      if (!intermediate) {
        pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                 super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
        if ((pQVar1 != (QBindingStatus *)0x0) &&
           (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
          QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
        }
        if ((data->super_QPropertyData<QAbstractAnimation::State>).val == Paused) {
          pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                   super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
          if ((pQVar1 != (QBindingStatus *)0x0) &&
             (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
            QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_00);
          }
          QAbstractAnimation::pause
                    ((QAbstractAnimation *)(data_00->super_QPropertyData<QAbstractAnimation_*>).val)
          ;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroupPrivate::activateCurrentAnimation(bool intermediate)
{
    if (!currentAnimation || state == QSequentialAnimationGroup::Stopped)
        return;

    currentAnimation->stop();

    // we ensure the direction is consistent with the group's direction
    currentAnimation->setDirection(direction);

    // connects to the finish signal of uncontrolled animations
    if (currentAnimation->totalDuration() == -1)
        connectUncontrolledAnimation(currentAnimation);

    currentAnimation->start();
    if (!intermediate && state == QSequentialAnimationGroup::Paused)
        currentAnimation->pause();
}